

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_block_statemach(Curl_easy *data,connectdata *conn)

{
  CURLcode local_2c;
  CURLcode result;
  pingpong *pp;
  ftp_conn *ftpc;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_2c = CURLE_OK;
  do {
    if ((conn->proto).ftpc.state == '\0') {
      return local_2c;
    }
    if (((((*(byte *)((long)&conn->proto + 0x112) >> 6 & 1) != 0) && (data != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
        (0 < Curl_trc_feat_ftp.log_level)))) {
      Curl_trc_ftp(data,"in shutdown, waiting for server response");
    }
    local_2c = Curl_pp_statemach(data,&(conn->proto).ftpc.pp,true,true);
  } while (local_2c == CURLE_OK);
  return local_2c;
}

Assistant:

static CURLcode ftp_block_statemach(struct Curl_easy *data,
                                    struct connectdata *conn)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  CURLcode result = CURLE_OK;

  while(ftpc->state != FTP_STOP) {
    if(ftpc->shutdown)
      CURL_TRC_FTP(data, "in shutdown, waiting for server response");
    result = Curl_pp_statemach(data, pp, TRUE, TRUE /* disconnecting */);
    if(result)
      break;
  }

  return result;
}